

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O1

int mk_channel_flush(mk_channel *channel)

{
  uint uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t count;
  size_t local_28;
  
  local_28 = 0;
  uVar3 = 0;
  do {
    uVar1 = mk_channel_write(channel,&local_28);
    uVar3 = uVar3 + local_28;
    if (0x1000 < uVar3) break;
  } while ((uVar1 & 0xb) == 0);
  if (((uVar1 & 0x14) != 0) && ((channel->event->mask & 4) == 0)) {
    puVar2 = (undefined8 *)pthread_getspecific(mk_tls_sched_worker_node);
    mk_event_add((mk_event_loop *)*puVar2,channel->fd,3,4,channel->event);
  }
  return uVar1;
}

Assistant:

int mk_channel_flush(struct mk_channel *channel)
{
    int ret = 0;
    size_t count = 0;
    size_t total = 0;
    uint32_t stop = (MK_CHANNEL_DONE | MK_CHANNEL_ERROR | MK_CHANNEL_EMPTY);

    do {
        ret = mk_channel_write(channel, &count);
        total += count;

#ifdef MK_HAVE_TRACE
        MK_TRACE("Channel flush: %d bytes", count);
        if (ret & MK_CHANNEL_DONE) {
            MK_TRACE("Channel was empty");
        }
        if (ret & MK_CHANNEL_ERROR) {
            MK_TRACE("Channel error");
        }
        if (ret & MK_CHANNEL_EMPTY) {
            MK_TRACE("Channel empty");
        }
#endif
    } while (total <= 4096 && ((ret & stop) == 0));

    if (ret == MK_CHANNEL_DONE) {
        MK_TRACE("Channel done");
        return ret;
    }
    else if (ret & (MK_CHANNEL_FLUSH | MK_CHANNEL_BUSY)) {
        MK_TRACE("Channel FLUSH | BUSY");
        if ((channel->event->mask & MK_EVENT_WRITE) == 0) {
            mk_event_add(mk_sched_loop(),
                         channel->fd,
                         MK_EVENT_CONNECTION,
                         MK_EVENT_WRITE,
                         channel->event);
        }
    }

    return ret;
}